

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlAddDocEntity(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  xmlEntityPtr val_04;
  int local_6c;
  int n_content;
  xmlChar *content;
  int n_SystemID;
  xmlChar *SystemID;
  int n_ExternalID;
  xmlChar *ExternalID;
  int n_type;
  int type;
  int n_name;
  xmlChar *name;
  int n_doc;
  xmlDocPtr doc;
  xmlEntityPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 4; name._4_4_ = name._4_4_ + 1) {
    for (n_type = 0; n_type < 5; n_type = n_type + 1) {
      for (ExternalID._4_4_ = 0; (int)ExternalID._4_4_ < 4; ExternalID._4_4_ = ExternalID._4_4_ + 1)
      {
        for (SystemID._4_4_ = 0; (int)SystemID._4_4_ < 5; SystemID._4_4_ = SystemID._4_4_ + 1) {
          for (content._4_4_ = 0; (int)content._4_4_ < 5; content._4_4_ = content._4_4_ + 1) {
            for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
              iVar1 = xmlMemBlocks();
              val = gen_xmlDocPtr(name._4_4_,0);
              val_00 = gen_const_xmlChar_ptr(n_type,1);
              iVar2 = gen_int(ExternalID._4_4_,2);
              val_01 = gen_const_xmlChar_ptr(SystemID._4_4_,3);
              val_02 = gen_const_xmlChar_ptr(content._4_4_,4);
              val_03 = gen_const_xmlChar_ptr(local_6c,5);
              val_04 = (xmlEntityPtr)xmlAddDocEntity(val,val_00,iVar2,val_01,val_02,val_03);
              desret_xmlEntityPtr(val_04);
              call_tests = call_tests + 1;
              des_xmlDocPtr(name._4_4_,val,0);
              des_const_xmlChar_ptr(n_type,val_00,1);
              des_int(ExternalID._4_4_,iVar2,2);
              des_const_xmlChar_ptr(SystemID._4_4_,val_01,3);
              des_const_xmlChar_ptr(content._4_4_,val_02,4);
              des_const_xmlChar_ptr(local_6c,val_03,5);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDocEntity",(ulong)(uint)(iVar2 - iVar1));
                ret_val._4_4_ = ret_val._4_4_ + 1;
                printf(" %d",(ulong)name._4_4_);
                printf(" %d",(ulong)(uint)n_type);
                printf(" %d",(ulong)ExternalID._4_4_);
                printf(" %d",(ulong)SystemID._4_4_);
                printf(" %d",(ulong)content._4_4_);
                printf(" %d");
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlAddDocEntity(void) {
    int test_ret = 0;

    int mem_base;
    xmlEntityPtr ret_val;
    xmlDocPtr doc; /* the document */
    int n_doc;
    const xmlChar * name; /* the entity name */
    int n_name;
    int type; /* the entity type XML_xxx_yyy_ENTITY */
    int n_type;
    const xmlChar * ExternalID; /* the entity external ID if available */
    int n_ExternalID;
    const xmlChar * SystemID; /* the entity system ID if available */
    int n_SystemID;
    const xmlChar * content; /* the entity content */
    int n_content;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_type = 0;n_type < gen_nb_int;n_type++) {
    for (n_ExternalID = 0;n_ExternalID < gen_nb_const_xmlChar_ptr;n_ExternalID++) {
    for (n_SystemID = 0;n_SystemID < gen_nb_const_xmlChar_ptr;n_SystemID++) {
    for (n_content = 0;n_content < gen_nb_const_xmlChar_ptr;n_content++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        type = gen_int(n_type, 2);
        ExternalID = gen_const_xmlChar_ptr(n_ExternalID, 3);
        SystemID = gen_const_xmlChar_ptr(n_SystemID, 4);
        content = gen_const_xmlChar_ptr(n_content, 5);

        ret_val = xmlAddDocEntity(doc, name, type, ExternalID, SystemID, content);
        desret_xmlEntityPtr(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_int(n_type, type, 2);
        des_const_xmlChar_ptr(n_ExternalID, ExternalID, 3);
        des_const_xmlChar_ptr(n_SystemID, SystemID, 4);
        des_const_xmlChar_ptr(n_content, content, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlAddDocEntity",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_name);
            printf(" %d", n_type);
            printf(" %d", n_ExternalID);
            printf(" %d", n_SystemID);
            printf(" %d", n_content);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}